

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_unit.cpp
# Opt level: O2

void test_roaring64_iterate_multi_roaring(void)

{
  bool bVar1;
  uint64_t iterate_count;
  Roaring64Map roaring;
  
  roaring.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &roaring.roarings._M_t._M_impl.super__Rb_tree_header._M_header;
  roaring.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  roaring.roarings._M_t._M_impl._0_8_ = 0;
  roaring.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  roaring.roarings._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  roaring.roarings._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  roaring.copyOnWrite = false;
  roaring.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       roaring.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar1 = ::roaring::Roaring64Map::addChecked(&roaring,1);
  _assert_true((ulong)bVar1,"roaring.addChecked(uint64_t(1))",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0xe3);
  bVar1 = ::roaring::Roaring64Map::addChecked(&roaring,2);
  _assert_true((ulong)bVar1,"roaring.addChecked(uint64_t(2))",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0xe4);
  bVar1 = ::roaring::Roaring64Map::addChecked(&roaring,0x100000000);
  _assert_true((ulong)bVar1,"roaring.addChecked(uint64_t(1) << 32)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0xe5);
  bVar1 = ::roaring::Roaring64Map::addChecked(&roaring,0x200000000);
  _assert_true((ulong)bVar1,"roaring.addChecked(uint64_t(2) << 32)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0xe6);
  iterate_count = 0;
  ::roaring::Roaring64Map::iterate
            (&roaring,test_roaring64_iterate_multi_roaring::anon_class_1_0_00000001::__invoke,
             &iterate_count);
  _assert_true((ulong)(iterate_count == 2),"iterate_count == 2",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0xef);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
               *)&roaring);
  return;
}

Assistant:

DEFINE_TEST(test_example_true) { test_example(true); }